

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::_q_monthChanged(QCalendarWidgetPrivate *this,QAction *act)

{
  QCalToolButton *this_00;
  int iVar1;
  int iVar2;
  QDate date;
  long in_FS_OFFSET;
  QDate currentDate;
  undefined1 *local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->monthButton;
  QAction::text();
  QAbstractButton::setText((QAbstractButton *)this_00,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this->m_view);
  local_60 = (undefined1 *)
             QtPrivate::QCalendarModel::dateForCell(this->m_model,local_58._0_4_,local_58._4_4_);
  QAction::data();
  iVar1 = ::QVariant::toInt((bool *)local_58.data);
  iVar2 = QDate::month(&local_60,*(undefined8 *)&this->m_model->m_calendar);
  date.jd = QDate::addMonths(&local_60,iVar1 - iVar2,*(undefined8 *)&this->m_model->m_calendar);
  ::QVariant::~QVariant((QVariant *)&local_58);
  updateCurrentPage(this,date);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_monthChanged(QAction *act)
{
    monthButton->setText(act->text());
    QDate currentDate = getCurrentDate();
    QDate newDate = currentDate.addMonths(act->data().toInt() - currentDate.month(m_model->m_calendar), m_model->m_calendar);
    updateCurrentPage(newDate);
}